

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstatusbar.cpp
# Opt level: O3

void __thiscall QStatusBar::showMessage(QStatusBar *this,QString *message,int timeout)

{
  long lVar1;
  long lVar2;
  char cVar3;
  QTimer *this_00;
  undefined4 *puVar4;
  long *plVar5;
  long in_FS_OFFSET;
  QStringView QVar6;
  QStringView QVar7;
  code *local_60;
  ImplFn local_58;
  Connection local_50;
  code *local_48;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  plVar5 = *(long **)(lVar1 + 0x290);
  if (timeout < 1) {
    if (plVar5 != (long *)0x0) {
      (**(code **)(*plVar5 + 0x20))();
      *(undefined8 *)(lVar1 + 0x290) = 0;
    }
  }
  else {
    if (plVar5 == (long *)0x0) {
      this_00 = (QTimer *)operator_new(0x10);
      QTimer::QTimer(this_00,(QObject *)this);
      *(QTimer **)(lVar1 + 0x290) = this_00;
      local_60 = clearMessage;
      local_58 = (ImplFn)0x0;
      local_48 = QTimer::timeout;
      local_40 = 0;
      puVar4 = (undefined4 *)operator_new(0x20);
      *puVar4 = 1;
      *(code **)(puVar4 + 2) =
           QtPrivate::QCallableObject<void_(QStatusBar::*)(),_QtPrivate::List<>,_void>::impl;
      *(code **)(puVar4 + 4) = clearMessage;
      *(undefined8 *)(puVar4 + 6) = 0;
      QObject::connectImpl
                ((QObject *)&local_50,(void **)this_00,(QObject *)&local_48,(void **)this,
                 (QSlotObjectBase *)&local_60,(ConnectionType)puVar4,(int *)0x0,(QMetaObject *)0x0);
      QMetaObject::Connection::~Connection(&local_50);
      plVar5 = *(long **)(lVar1 + 0x290);
    }
    QTimer::start((int)plVar5);
  }
  lVar2 = *(long *)(lVar1 + 0x280);
  if (lVar2 == (message->d).size) {
    QVar6.m_data = *(storage_type_conflict **)(lVar1 + 0x278);
    QVar6.m_size = lVar2;
    QVar7.m_data = (message->d).ptr;
    QVar7.m_size = lVar2;
    cVar3 = QtPrivate::equalStrings(QVar6,QVar7);
    if (cVar3 != '\0') goto LAB_004877f0;
  }
  QString::operator=((QString *)(lVar1 + 0x270),(QString *)message);
  hideOrShow(this);
LAB_004877f0:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStatusBar::showMessage(const QString &message, int timeout)
{
    Q_D(QStatusBar);

    if (timeout > 0) {
        if (!d->timer) {
            d->timer = new QTimer(this);
            connect(d->timer, &QTimer::timeout, this, &QStatusBar::clearMessage);
        }
        d->timer->start(timeout);
    } else if (d->timer) {
        delete d->timer;
        d->timer = nullptr;
    }
    if (d->tempItem == message)
        return;
    d->tempItem = message;

    hideOrShow();
}